

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O0

void Map_NodeTryDroppingOnePhase(Map_Man_t *p,Map_Node_t *pNode)

{
  Map_Cut_t *pMVar1;
  Map_Cut_t *pMVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  int fUsePhase0;
  int fUsePhase1;
  float tWorst1Using0;
  float tWorst0Using1;
  Map_Match_t *pMatchBest1;
  Map_Match_t *pMatchBest0;
  Map_Node_t *pNode_local;
  Map_Man_t *p_local;
  
  if (((pNode->pCutBest[0] != (Map_Cut_t *)0x0) && (pNode->pCutBest[1] != (Map_Cut_t *)0x0)) &&
     (p->fMappingMode != 1)) {
    pMVar1 = pNode->pCutBest[0];
    pMVar2 = pNode->pCutBest[1];
    fVar5 = Map_TimeMatchWithInverter(p,pMVar2->M + 1);
    fVar6 = Map_TimeMatchWithInverter(p,pMVar1->M);
    if ((p->fMappingMode != 0) || (1e+09 < p->DelayTarget || p->DelayTarget == 1e+09)) {
      if ((pNode->nRefAct[0] != 0) && (pNode->nRefAct[1] != 0)) {
        bVar4 = false;
        bVar3 = false;
        if (p->fMappingMode == 2) {
          bVar3 = (p->pSuperLib->tDelayInv).Worst * 3.0 + fVar6 + p->fEpsilon <
                  pNode->tRequired[1].Worst;
          bVar4 = (p->pSuperLib->tDelayInv).Worst * 3.0 + fVar5 + p->fEpsilon <
                  pNode->tRequired[0].Worst;
        }
        else if ((p->fMappingMode == 3) || (p->fMappingMode == 4)) {
          bVar3 = fVar6 + p->fEpsilon < pNode->tRequired[1].Worst;
          bVar4 = fVar5 + p->fEpsilon < pNode->tRequired[0].Worst;
        }
        if ((bVar3 != false) || (bVar4 != false)) {
          if ((bVar3 != false) && (bVar4 != false)) {
            if (pMVar2->M[1].AreaFlow <= pMVar1->M[0].AreaFlow) {
              bVar3 = false;
            }
            else {
              bVar4 = false;
            }
          }
          if (bVar3 == bVar4) {
            __assert_fail("fUsePhase0 ^ fUsePhase1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperMatch.c"
                          ,0x1ec,"void Map_NodeTryDroppingOnePhase(Map_Man_t *, Map_Node_t *)");
          }
          if (bVar3 == false) {
            if ((1 < p->fMappingMode) && (0 < pNode->nRefAct[0])) {
              Map_CutDeref(pNode->pCutBest[0],0,p->fUseProfile);
            }
            pNode->pCutBest[0] = (Map_Cut_t *)0x0;
            if ((1 < p->fMappingMode) && (pNode->nRefAct[1] == 0)) {
              Map_CutRef(pNode->pCutBest[1],1,p->fUseProfile);
            }
          }
          else {
            if ((1 < p->fMappingMode) && (0 < pNode->nRefAct[1])) {
              Map_CutDeref(pNode->pCutBest[1],1,p->fUseProfile);
            }
            pNode->pCutBest[1] = (Map_Cut_t *)0x0;
            if ((1 < p->fMappingMode) && (pNode->nRefAct[0] == 0)) {
              Map_CutRef(pNode->pCutBest[0],0,p->fUseProfile);
            }
          }
        }
      }
    }
    else if (pMVar1->M[0].tArrive.Worst <= fVar5 + p->fEpsilon) {
      if (fVar6 + p->fEpsilon < pMVar2->M[1].tArrive.Worst) {
        pNode->pCutBest[1] = (Map_Cut_t *)0x0;
      }
    }
    else {
      pNode->pCutBest[0] = (Map_Cut_t *)0x0;
    }
  }
  return;
}

Assistant:

void Map_NodeTryDroppingOnePhase( Map_Man_t * p, Map_Node_t * pNode )
{
    Map_Match_t * pMatchBest0, * pMatchBest1;
    float tWorst0Using1, tWorst1Using0; 
    int fUsePhase1, fUsePhase0;

    // nothing to do if one of the phases is already dropped
    if ( pNode->pCutBest[0] == NULL || pNode->pCutBest[1] == NULL )
        return;

    // do not drop while recovering area flow
    if ( p->fMappingMode == 1 )//|| p->fMappingMode == 2 )
        return;

    // get the pointers to the matches of the best cuts
    pMatchBest0 = pNode->pCutBest[0]->M + 0;
    pMatchBest1 = pNode->pCutBest[1]->M + 1;

    // get the worst arrival times of each phase
    // implemented using the other phase with inverter added
    tWorst0Using1 = Map_TimeMatchWithInverter( p, pMatchBest1 );
    tWorst1Using0 = Map_TimeMatchWithInverter( p, pMatchBest0 );

    // consider the case of mapping for delay
    if ( p->fMappingMode == 0 && p->DelayTarget < ABC_INFINITY )
    { 
        // if the arrival time of a phase is larger than the arrival time 
        // of the opposite phase plus the inverter, drop this phase
        if ( pMatchBest0->tArrive.Worst > tWorst0Using1 + p->fEpsilon ) 
            pNode->pCutBest[0] = NULL;
        else if ( pMatchBest1->tArrive.Worst > tWorst1Using0 + p->fEpsilon ) 
            pNode->pCutBest[1] = NULL;
        return;
    }

    // do not perform replacement if one of the phases is unused
    if ( pNode->nRefAct[0] == 0 || pNode->nRefAct[1] == 0 )
        return;
 
    // check if replacement of each phase is possible using required times
    fUsePhase0 = fUsePhase1 = 0;
    if ( p->fMappingMode == 2 )
    {
        fUsePhase0 = (pNode->tRequired[1].Worst > tWorst1Using0 + 3*p->pSuperLib->tDelayInv.Worst + p->fEpsilon);
        fUsePhase1 = (pNode->tRequired[0].Worst > tWorst0Using1 + 3*p->pSuperLib->tDelayInv.Worst + p->fEpsilon);
    }
    else if ( p->fMappingMode == 3 || p->fMappingMode == 4 )
    {
        fUsePhase0 = (pNode->tRequired[1].Worst > tWorst1Using0 + p->fEpsilon);
        fUsePhase1 = (pNode->tRequired[0].Worst > tWorst0Using1 + p->fEpsilon);
    }
    if ( !fUsePhase0 && !fUsePhase1 )
        return;

    // if replacement is possible both ways, use the one that works better
    if ( fUsePhase0 && fUsePhase1 )
    {
        if ( pMatchBest0->AreaFlow < pMatchBest1->AreaFlow )
            fUsePhase1 = 0;
        else
            fUsePhase0 = 0;
    }
    // only one phase should be used
    assert( fUsePhase0 ^ fUsePhase1 );

    // set the corresponding cut to NULL
    if ( fUsePhase0 )
    {
        // deref phase 1 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[1] > 0 )
            Map_CutDeref( pNode->pCutBest[1], 1, p->fUseProfile );
        // get rid of the cut
        pNode->pCutBest[1] = NULL;
        // ref phase 0 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[0] == 0 )
            Map_CutRef( pNode->pCutBest[0], 0, p->fUseProfile );
    }
    else
    {
        // deref phase 0 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[0] > 0 )
            Map_CutDeref( pNode->pCutBest[0], 0, p->fUseProfile );
        // get rid of the cut
        pNode->pCutBest[0] = NULL;
        // ref phase 1 cut if necessary
        if ( p->fMappingMode >= 2 && pNode->nRefAct[1] == 0 )
            Map_CutRef( pNode->pCutBest[1], 1, p->fUseProfile );
    }
}